

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHCurl.cpp
# Opt level: O0

void TPZShapeHCurl<pzshape::TPZShapeTriang>::StaticIndexShapeToVec
               (TPZVec<int> *connectOrder,TPZVec<long> *firstH1ShapeFunc,TPZVec<int> *sidesH1Ord,
               TPZVec<long> *nodeIds,TPZVec<unsigned_int> *shapeCountVec,
               TPZVec<std::pair<int,_long>_> *indexVecShape)

{
  int iVar1;
  int iVar2;
  MElementType MVar3;
  int *piVar4;
  pair<int,_long> *ppVar5;
  uint *puVar6;
  long *plVar7;
  TPZVec<int> *pTVar8;
  int64_t iVar9;
  ostream *poVar10;
  TPZVec<long> *in_RSI;
  long lVar11;
  TPZVec<int> *in_RDI;
  TPZVec<unsigned_int> *in_R8;
  TPZVec<std::pair<int,_long>_> *in_R9;
  pair<int,_long> pVar12;
  uint nVfiFuncs;
  long shapeIndex_4;
  int vecIndex_3;
  int iFunc_1;
  int nFaceInternalFuncs;
  anon_class_32_4_a9a08e53 AddFromVec;
  long shapeIndex_3;
  int iFunc;
  int vecindex [2];
  int county;
  int countx;
  int countxy;
  TPZVec<std::pair<int,_int>_> funcY;
  TPZVec<std::pair<int,_int>_> funcX;
  TPZVec<std::pair<int,_int>_> funcXY;
  int nfuncsk1;
  int nfuncsk;
  int hCurlFaceOrder;
  int ydir;
  int xdir;
  int transid;
  bool quadFace;
  int nH1FaceFuncs;
  uint nVfeFuncs;
  int shapeIndex_2;
  int iEdgeInternal_1;
  int vecIndex_2;
  int currentEdge;
  int currentLocalEdge;
  int iEdge;
  int *nFaceEdges_1;
  int nFaceNodes;
  TPZManVector<int,_4> permutedSideSides;
  int h1FaceOrder;
  int iFace_1;
  int64_t iSide;
  int iCon_2;
  TPZGenMatrix<int> shapeorders;
  int nH1Funcs;
  int firstVfOrthVec;
  int firstVftVec;
  int nFaceEdges;
  int iFace;
  int nEdgeVectors;
  TPZManVector<TPZStack<int,_10>,_10> faceEdges;
  TPZManVector<int,_10> firstVfeVec;
  int firstFaceShape;
  int shapeIndex_1;
  int iEdgeInternal;
  int vecIndex;
  int64_t shapeIndex;
  int vecIndex_1;
  int whichNode;
  int iNode;
  int pOrder;
  int iCon_1;
  uint shapeCount;
  int iCon;
  TPZManVector<int,_4> transformationIds;
  int64_t nConnects;
  int64_t nNodes;
  int nEdges;
  int nFaces;
  uint *in_stack_fffffffffffff6b8;
  TPZManVector<int,_10> *in_stack_fffffffffffff6c0;
  TPZVec<long> *in_stack_fffffffffffff6c8;
  TPZManVector<TPZStack<int,_10>,_10> *in_stack_fffffffffffff6d0;
  undefined4 in_stack_fffffffffffff6d8;
  undefined4 in_stack_fffffffffffff6dc;
  TPZGenMatrix<int> *in_stack_fffffffffffff6e0;
  pair<int,_int> *in_stack_fffffffffffff6e8;
  TPZManVector<int,_10> *in_stack_fffffffffffff6f0;
  TPZVec<std::pair<int,_int>_> *in_stack_fffffffffffff6f8;
  TPZVec<std::pair<int,_int>_> *in_stack_fffffffffffff700;
  TPZVec<std::pair<int,_int>_> *in_stack_fffffffffffff708;
  TPZVec<std::pair<int,_int>_> *in_stack_fffffffffffff710;
  TPZGenMatrix<int> *in_stack_fffffffffffff750;
  TPZVec<int> *in_stack_fffffffffffff758;
  TPZVec<long> *in_stack_fffffffffffff760;
  int64_t in_stack_fffffffffffff768;
  undefined4 in_stack_fffffffffffff770;
  undefined4 in_stack_fffffffffffff774;
  int local_804;
  int local_7e8;
  int local_774;
  pair<int,_long> local_678;
  long local_668;
  int local_65c;
  int local_658;
  int local_654;
  TPZVec<std::pair<int,_long>_> *local_5f0;
  TPZVec<unsigned_int> *local_5e8;
  uint *local_5e0;
  int local_5d8;
  pair<int,_int> local_5d0;
  pair<int,_int> local_5c8;
  pair<int,_int> local_5c0;
  pair<int,_int> local_5b8;
  long local_5b0;
  int local_5a8;
  int local_5a4;
  int local_5a0;
  int local_59c;
  int local_598;
  int local_594;
  TPZVec<std::pair<int,_int>_> local_590;
  TPZVec<std::pair<int,_int>_> local_570;
  TPZVec<std::pair<int,_int>_> local_550;
  int local_52c;
  int in_stack_fffffffffffffad8;
  int in_stack_fffffffffffffadc;
  int in_stack_fffffffffffffae0;
  int in_stack_fffffffffffffae4;
  pair<int,_int> local_508;
  int local_500;
  int local_4fc;
  int local_4f8;
  int local_4f4;
  int local_4f0;
  int local_4ec;
  int *local_4e8;
  int local_4e0 [2];
  TPZVec<int> local_4d8;
  int local_4a8;
  int local_4a4;
  long local_4a0;
  int local_494;
  int local_478;
  int local_474;
  int local_470;
  int local_46c;
  int local_468;
  int local_464;
  TPZVec<TPZStack<int,_10>_> local_418 [23];
  undefined4 local_124;
  TPZVec<int> local_120 [2];
  uint local_d8;
  pair<int,_int> local_d4;
  int local_cc;
  int local_c8;
  int local_c4;
  pair<int,_long> local_c0;
  long local_b0;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  uint local_90 [4];
  int local_80;
  undefined4 local_7c;
  TPZVec<int> local_78;
  int64_t local_48;
  undefined8 local_40;
  int local_38;
  int local_34;
  TPZVec<std::pair<int,_long>_> *local_30;
  TPZVec<unsigned_int> *local_28;
  TPZVec<long> *local_10;
  TPZVec<int> *local_8;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_34 = pztopology::TPZTriangle::NumSides(0x18beb01);
  local_38 = pztopology::TPZTriangle::NumSides(0x18beb12);
  local_40 = 3;
  local_48 = TPZVec<int>::size(local_8);
  local_7c = 0xffffffff;
  TPZManVector<int,_4>::TPZManVector
            ((TPZManVector<int,_4> *)in_stack_fffffffffffff6f0,(int64_t)in_stack_fffffffffffff6e8,
             (int *)in_stack_fffffffffffff6e0);
  for (local_80 = 0; local_80 < local_48; local_80 = local_80 + 1) {
    iVar2 = pztopology::TPZTriangle::GetTransformId
                      ((int)in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8);
    piVar4 = TPZVec<int>::operator[](&local_78,(long)local_80);
    *piVar4 = iVar2;
  }
  local_90[0] = 0;
  for (local_94 = 0; local_94 < local_38; local_94 = local_94 + 1) {
    piVar4 = TPZVec<int>::operator[](local_8,(long)local_94);
    local_98 = *piVar4;
    for (local_9c = 0; local_9c < 2; local_9c = local_9c + 1) {
      piVar4 = TPZVec<int>::operator[](&local_78,(long)local_94);
      if (*piVar4 == 0) {
        local_774 = local_9c;
      }
      else {
        local_774 = (local_9c + 1) % 2;
      }
      local_a0 = local_774;
      local_a4 = local_774 + local_94 * 2;
      iVar2 = pztopology::TPZTriangle::SideNodeLocId
                        ((int)in_stack_fffffffffffff6c0,
                         (int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
      local_b0 = (long)iVar2;
      pVar12 = std::make_pair<int_const&,long_const&>
                         ((int *)in_stack_fffffffffffff6c0,(long *)in_stack_fffffffffffff6b8);
      local_c0.second = pVar12.second;
      local_c0.first = pVar12.first;
      ppVar5 = TPZVec<std::pair<int,_long>_>::operator[](local_30,(ulong)local_90[0]);
      std::pair<int,_long>::operator=(ppVar5,&local_c0);
      local_90[0] = local_90[0] + 1;
      puVar6 = TPZVec<unsigned_int>::operator[](local_28,(long)local_94);
      *puVar6 = *puVar6 + 1;
    }
    local_c4 = local_38 * 2 + local_94;
    for (local_c8 = 0; local_c8 < local_98 + -1; local_c8 = local_c8 + 1) {
      plVar7 = TPZVec<long>::operator[](local_10,(long)local_94);
      local_cc = (int)*plVar7 + local_c8;
      local_d4 = std::make_pair<int_const&,int_const&>
                           ((int *)in_stack_fffffffffffff6b8,(int *)0x18bee70);
      ppVar5 = TPZVec<std::pair<int,_long>_>::operator[](local_30,(ulong)local_90[0]);
      std::pair<int,long>::operator=((pair<int,long> *)ppVar5,&local_d4);
      local_90[0] = local_90[0] + 1;
      puVar6 = TPZVec<unsigned_int>::operator[](local_28,(long)local_94);
      *puVar6 = *puVar6 + 1;
    }
  }
  local_d8 = local_90[0];
  local_124 = 0xffffffff;
  TPZManVector<int,_10>::TPZManVector
            (in_stack_fffffffffffff6f0,(int64_t)in_stack_fffffffffffff6e8,
             (int *)in_stack_fffffffffffff6e0);
  TPZStack<int,_10>::TPZStack
            ((TPZStack<int,_10> *)in_stack_fffffffffffff6c0,
             (int)((ulong)in_stack_fffffffffffff6b8 >> 0x20),(int)in_stack_fffffffffffff6b8);
  TPZManVector<TPZStack<int,_10>,_10>::TPZManVector
            ((TPZManVector<TPZStack<int,_10>,_10> *)
             CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770),in_stack_fffffffffffff768
             ,(TPZStack<int,_10> *)in_stack_fffffffffffff760);
  TPZStack<int,_10>::~TPZStack((TPZStack<int,_10> *)0x18befb4);
  iVar2 = local_38 * 3;
  local_464 = iVar2;
  piVar4 = TPZVec<int>::operator[](local_120,0);
  *piVar4 = iVar2;
  for (local_468 = 0; local_468 < local_34; local_468 = local_468 + 1) {
    TPZVec<TPZStack<int,_10>_>::operator[](local_418,(long)local_468);
    pztopology::TPZTriangle::LowerDimensionSides
              ((int)((ulong)in_stack_fffffffffffff6d0 >> 0x20),
               (TPZStack<int,_10> *)in_stack_fffffffffffff6c8,
               (int)((ulong)in_stack_fffffffffffff6c0 >> 0x20));
    if (local_468 == 0) {
      local_7e8 = 0;
    }
    else {
      pTVar8 = (TPZVec<int> *)
               TPZVec<TPZStack<int,_10>_>::operator[](local_418,(long)(local_468 + -1));
      iVar9 = TPZVec<int>::size(pTVar8);
      local_7e8 = (int)iVar9;
    }
    local_46c = local_7e8;
    if (local_468 == 0) {
      piVar4 = TPZVec<int>::operator[](local_120,0);
      local_804 = *piVar4;
    }
    else {
      piVar4 = TPZVec<int>::operator[](local_120,(long)(local_468 + -1));
      local_804 = *piVar4 + local_46c;
    }
    piVar4 = TPZVec<int>::operator[](local_120,(long)local_468);
    *piVar4 = local_804;
  }
  piVar4 = TPZVec<int>::operator[](local_120,(long)(local_34 + -1));
  iVar2 = *piVar4;
  pTVar8 = (TPZVec<int> *)TPZVec<TPZStack<int,_10>_>::operator[](local_418,(long)(local_34 + -1));
  iVar9 = TPZVec<int>::size(pTVar8);
  local_470 = iVar2 + (int)iVar9;
  local_474 = local_470 + local_34 * 2;
  local_478 = pzshape::TPZShapeTriang::NShapeF(&in_stack_fffffffffffff6c0->super_TPZVec<int>);
  TPZGenMatrix<int>::TPZGenMatrix
            (in_stack_fffffffffffff6e0,CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8)
             ,(int64_t)in_stack_fffffffffffff6d0);
  pzshape::TPZShapeTriang::ShapeOrder
            (in_stack_fffffffffffff760,in_stack_fffffffffffff758,in_stack_fffffffffffff750);
  for (local_494 = local_38; local_494 < local_38 + local_34; local_494 = local_494 + 1) {
    local_4a0 = (long)local_494 + 3;
    local_4a4 = local_494 - local_38;
    local_4a8 = -1;
    local_4e0[1] = 0xffffffff;
    TPZManVector<int,_4>::TPZManVector
              ((TPZManVector<int,_4> *)in_stack_fffffffffffff6f0,(int64_t)in_stack_fffffffffffff6e8,
               (int *)in_stack_fffffffffffff6e0);
    MVar3 = pztopology::TPZTriangle::Type((int)local_4a0);
    if (MVar3 == ETriangle) {
      TPZVec<int>::operator[](&local_78,(long)local_494);
      pztopology::GetPermutation<pztopology::TPZTriangle>
                ((int)((ulong)in_stack_fffffffffffff6d0 >> 0x20),
                 (TPZVec<int> *)in_stack_fffffffffffff6c8);
      piVar4 = TPZVec<int>::operator[](local_8,(long)local_494);
      local_4a8 = *piVar4;
    }
    else if (MVar3 == EQuadrilateral) {
      TPZVec<int>::operator[](&local_78,(long)local_494);
      pztopology::GetPermutation<pztopology::TPZQuadrilateral>
                ((int)((ulong)in_stack_fffffffffffff6d0 >> 0x20),
                 (TPZVec<int> *)in_stack_fffffffffffff6c8);
      piVar4 = TPZVec<int>::operator[](local_8,(long)local_494);
      local_4a8 = *piVar4 + 1;
    }
    else {
      poVar10 = std::operator<<((ostream *)&std::cerr,
                                "static void TPZShapeHCurl<pzshape::TPZShapeTriang>::StaticIndexShapeToVec(const TPZVec<int> &, const TPZVec<int64_t> &, const TPZVec<int> &, const TPZVec<int64_t> &, TPZVec<unsigned int> &, TPZVec<std::pair<int, int64_t>> &) [TSHAPE = pzshape::TPZShapeTriang]"
                               );
      poVar10 = std::operator<<(poVar10," error.");
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      pzinternal::DebugStopImpl
                ((char *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                 CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
    }
    local_4e0[0] = pztopology::TPZTriangle::NSideNodes((int)local_4a0);
    local_4e8 = local_4e0;
    for (local_4ec = 0; local_4ec < *local_4e8; local_4ec = local_4ec + 1) {
      piVar4 = TPZVec<int>::operator[](&local_4d8,(long)(local_4ec + local_4e0[0]));
      local_4f0 = *piVar4;
      local_4f4 = pztopology::TPZTriangle::ContainedSideLocId
                            ((int)in_stack_fffffffffffff6c0,
                             (int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
      piVar4 = TPZVec<int>::operator[](local_120,(long)local_4a4);
      local_4f8 = (*piVar4 + local_4f0) - local_4e0[0];
      for (local_4fc = 0; local_4fc < local_4a8 + -1; local_4fc = local_4fc + 1) {
        plVar7 = TPZVec<long>::operator[](local_10,(long)local_4f4 + -3);
        local_500 = (int)*plVar7 + local_4fc;
        local_508 = std::make_pair<int_const&,int_const&>
                              ((int *)in_stack_fffffffffffff6b8,(int *)0x18bf6aa);
        ppVar5 = TPZVec<std::pair<int,_long>_>::operator[](local_30,(ulong)local_90[0]);
        std::pair<int,long>::operator=((pair<int,long> *)ppVar5,&local_508);
        local_90[0] = local_90[0] + 1;
        puVar6 = TPZVec<unsigned_int>::operator[](local_28,(long)local_494);
        *puVar6 = *puVar6 + 1;
      }
    }
    TPZVec<unsigned_int>::operator[](local_28,(long)local_494);
    iVar2 = pzshape::TPZShapeTriang::NConnectShapeF
                      ((int)in_stack_fffffffffffff6c0,
                       (int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
    MVar3 = pztopology::TPZTriangle::Type((int)local_4a0);
    if (MVar3 == EQuadrilateral) {
      piVar4 = TPZVec<int>::operator[](&local_78,(long)local_494);
      iVar1 = (*piVar4 + 1) - (*piVar4 + 1 >> 0x1f);
      in_stack_fffffffffffffae4 = iVar1 >> 1;
      in_stack_fffffffffffffae4 =
           in_stack_fffffffffffffae4 - (in_stack_fffffffffffffae4 - (iVar1 >> 0x1f) & 0xfffffffeU);
      in_stack_fffffffffffffae0 = 1 - in_stack_fffffffffffffae4;
      in_stack_fffffffffffffadc = local_4a8 + -1;
      in_stack_fffffffffffffad8 = (local_4a8 + -2) * (local_4a8 + -2) * 2;
      local_52c = local_4a8 + -2;
      TPZVec<std::pair<int,_int>_>::TPZVec
                (in_stack_fffffffffffff700,(int64_t)in_stack_fffffffffffff6f8);
      TPZVec<std::pair<int,_int>_>::TPZVec
                (in_stack_fffffffffffff700,(int64_t)in_stack_fffffffffffff6f8);
      TPZVec<std::pair<int,_int>_>::TPZVec
                (in_stack_fffffffffffff700,(int64_t)in_stack_fffffffffffff6f8);
      local_594 = 0;
      local_598 = 0;
      local_59c = 0;
      local_5a4 = local_470 + local_4a4 * 2;
      local_5a0 = local_470 + local_4a4 * 2 + 1;
      for (local_5a8 = 0; local_5a8 < iVar2; local_5a8 = local_5a8 + 1) {
        plVar7 = TPZVec<long>::operator[](local_10,(long)local_494);
        local_5b0 = *plVar7 + (long)local_5a8;
        piVar4 = TPZGenMatrix<int>::operator()
                           ((TPZGenMatrix<int> *)in_stack_fffffffffffff6c8,
                            (int64_t)in_stack_fffffffffffff6c0,(int64_t)in_stack_fffffffffffff6b8);
        if ((in_stack_fffffffffffffadc < *piVar4) ||
           (piVar4 = TPZGenMatrix<int>::operator()
                               ((TPZGenMatrix<int> *)in_stack_fffffffffffff6c8,
                                (int64_t)in_stack_fffffffffffff6c0,
                                (int64_t)in_stack_fffffffffffff6b8),
           in_stack_fffffffffffffadc < *piVar4)) {
          in_stack_fffffffffffff700 =
               (TPZVec<std::pair<int,_int>_> *)
               TPZGenMatrix<int>::operator()
                         ((TPZGenMatrix<int> *)in_stack_fffffffffffff6c8,
                          (int64_t)in_stack_fffffffffffff6c0,(int64_t)in_stack_fffffffffffff6b8);
          if (in_stack_fffffffffffffadc < *(int *)&in_stack_fffffffffffff700->_vptr_TPZVec) {
            in_stack_fffffffffffff6f0 =
                 (TPZManVector<int,_10> *)
                 TPZGenMatrix<int>::operator()
                           ((TPZGenMatrix<int> *)in_stack_fffffffffffff6c8,
                            (int64_t)in_stack_fffffffffffff6c0,(int64_t)in_stack_fffffffffffff6b8);
            if (*(int *)&(in_stack_fffffffffffff6f0->super_TPZVec<int>)._vptr_TPZVec <=
                in_stack_fffffffffffffadc) {
              std::pair<int,_int>::pair<const_long_&,_true>(&local_5d0,&local_5a0,&local_5b0);
              lVar11 = (long)local_59c;
              local_59c = local_59c + 1;
              in_stack_fffffffffffff6e8 =
                   TPZVec<std::pair<int,_int>_>::operator[](&local_590,lVar11);
              std::pair<int,_int>::operator=(in_stack_fffffffffffff6e8,&local_5d0);
            }
          }
          else {
            std::pair<int,_int>::pair<const_long_&,_true>(&local_5c8,&local_5a4,&local_5b0);
            lVar11 = (long)local_598;
            local_598 = local_598 + 1;
            in_stack_fffffffffffff6f8 =
                 (TPZVec<std::pair<int,_int>_> *)
                 TPZVec<std::pair<int,_int>_>::operator[](&local_570,lVar11);
            std::pair<int,_int>::operator=((pair<int,_int> *)in_stack_fffffffffffff6f8,&local_5c8);
          }
        }
        else {
          std::pair<int,_int>::pair<const_long_&,_true>(&local_5b8,&local_5a4,&local_5b0);
          lVar11 = (long)local_594;
          local_594 = local_594 + 1;
          in_stack_fffffffffffff710 =
               (TPZVec<std::pair<int,_int>_> *)
               TPZVec<std::pair<int,_int>_>::operator[](&local_550,lVar11);
          std::pair<int,_int>::operator=((pair<int,_int> *)in_stack_fffffffffffff710,&local_5b8);
          std::pair<int,_int>::pair<const_long_&,_true>(&local_5c0,&local_5a0,&local_5b0);
          lVar11 = (long)local_594;
          local_594 = local_594 + 1;
          in_stack_fffffffffffff708 =
               (TPZVec<std::pair<int,_int>_> *)
               TPZVec<std::pair<int,_int>_>::operator[](&local_550,lVar11);
          std::pair<int,_int>::operator=((pair<int,_int> *)in_stack_fffffffffffff708,&local_5c0);
        }
      }
      local_5f0 = local_30;
      local_5e8 = local_28;
      local_5e0 = local_90;
      local_5d8 = local_494;
      TPZVec<std::pair<int,_int>_>::TPZVec(in_stack_fffffffffffff710,in_stack_fffffffffffff708);
      StaticIndexShapeToVec::anon_class_32_4_a9a08e53::operator()
                ((anon_class_32_4_a9a08e53 *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
      TPZVec<std::pair<int,_int>_>::~TPZVec
                ((TPZVec<std::pair<int,_int>_> *)in_stack_fffffffffffff6c0);
      TPZVec<std::pair<int,_int>_>::TPZVec(in_stack_fffffffffffff710,in_stack_fffffffffffff708);
      StaticIndexShapeToVec::anon_class_32_4_a9a08e53::operator()
                ((anon_class_32_4_a9a08e53 *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
      TPZVec<std::pair<int,_int>_>::~TPZVec
                ((TPZVec<std::pair<int,_int>_> *)in_stack_fffffffffffff6c0);
      TPZVec<std::pair<int,_int>_>::TPZVec(in_stack_fffffffffffff710,in_stack_fffffffffffff708);
      StaticIndexShapeToVec::anon_class_32_4_a9a08e53::operator()
                ((anon_class_32_4_a9a08e53 *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
      TPZVec<std::pair<int,_int>_>::~TPZVec
                ((TPZVec<std::pair<int,_int>_> *)in_stack_fffffffffffff6c0);
      TPZVec<std::pair<int,_int>_>::~TPZVec
                ((TPZVec<std::pair<int,_int>_> *)in_stack_fffffffffffff6c0);
      TPZVec<std::pair<int,_int>_>::~TPZVec
                ((TPZVec<std::pair<int,_int>_> *)in_stack_fffffffffffff6c0);
      TPZVec<std::pair<int,_int>_>::~TPZVec
                ((TPZVec<std::pair<int,_int>_> *)in_stack_fffffffffffff6c0);
    }
    else {
      local_654 = iVar2 << 1;
      for (local_658 = 0; local_658 < local_654; local_658 = local_658 + 1) {
        local_65c = local_470 + local_4a4 * 2 + local_658 % 2;
        in_stack_fffffffffffff6e0 =
             (TPZGenMatrix<int> *)TPZVec<long>::operator[](local_10,(long)local_494);
        local_668 = (long)in_stack_fffffffffffff6e0->fMem + (long)(local_658 / 2);
        pVar12 = std::make_pair<int_const&,long_const&>
                           ((int *)in_stack_fffffffffffff6c0,(long *)in_stack_fffffffffffff6b8);
        in_stack_fffffffffffff6d0 = (TPZManVector<TPZStack<int,_10>,_10> *)pVar12.second;
        local_678.first = pVar12.first;
        local_678.second = (long)in_stack_fffffffffffff6d0;
        in_stack_fffffffffffff6c8 =
             (TPZVec<long> *)TPZVec<std::pair<int,_long>_>::operator[](local_30,(ulong)local_90[0]);
        std::pair<int,_long>::operator=((pair<int,_long> *)in_stack_fffffffffffff6c8,&local_678);
        local_90[0] = local_90[0] + 1;
        in_stack_fffffffffffff6c0 =
             (TPZManVector<int,_10> *)TPZVec<unsigned_int>::operator[](local_28,(long)local_494);
        *(uint *)&(in_stack_fffffffffffff6c0->super_TPZVec<int>)._vptr_TPZVec =
             *(uint *)&(in_stack_fffffffffffff6c0->super_TPZVec<int>)._vptr_TPZVec + 1;
      }
    }
    in_stack_fffffffffffff6b8 = TPZVec<unsigned_int>::operator[](local_28,(long)local_494);
    TPZManVector<int,_4>::~TPZManVector((TPZManVector<int,_4> *)in_stack_fffffffffffff6c0);
  }
  TPZGenMatrix<int>::~TPZGenMatrix((TPZGenMatrix<int> *)in_stack_fffffffffffff6c0);
  TPZManVector<TPZStack<int,_10>,_10>::~TPZManVector(in_stack_fffffffffffff6d0);
  TPZManVector<int,_10>::~TPZManVector(in_stack_fffffffffffff6c0);
  TPZManVector<int,_4>::~TPZManVector((TPZManVector<int,_4> *)in_stack_fffffffffffff6c0);
  return;
}

Assistant:

void TPZShapeHCurl<TSHAPE>::StaticIndexShapeToVec(const TPZVec<int>& connectOrder,
                                                  const TPZVec<int64_t>& firstH1ShapeFunc,
                                                  const TPZVec<int>& sidesH1Ord,
                                                  const TPZVec<int64_t>& nodeIds,
                                                  TPZVec<unsigned int>& shapeCountVec,
                                                  TPZVec<std::pair<int,int64_t>> & indexVecShape
                                                  ) {



    //                                                  TPZVec<std::pair<int,int64_t>> & indexVecShape,
    //                                                       const TPZVec<int>& connectOrder,
    //                                                       const TPZVec<int64_t>& firstH1ShapeFunc,
    //                                                       const TPZVec<int>& sidesH1Ord,
    //                                                       TPZVec<unsigned int>& shapeCountVec,
    //                                                       const TPZVec<int64_t>& nodeIds) {
    /******************************************************************************************************************
     * The directions are calculated based on the LOCAL side ids (and SideNodeLocId), such as the H1 shape functions.
     * For instance, for the triangle, the vectors are:
     * vea30 vea31 vea41 vea42 vea52 vea51 vet3 vet4 vet5 vfe63 vfe64 vfe65 vft1 vft2
     * and the shapes will be organized as follows:
     * phi0 phi1 phi2  phi31 phi32 ... phi3i   phi41 phi42 ... phi4j   phi51 phi52 ... phi5k   phi61 phi62 ... phi6n
     *^^^^^^^^^^^^^^^  ^^^^^^^^^^^^^^^^^^^^^   ^^^^^^^^^^^^^^^^^^^^^   ^^^^^^^^^^^^^^^^^^^^^   ^^^^^^^^^^^^^^^^^^^^^
     *  corner funcs       edge 3 funcs            edge 4 funcs            edge 5 funcs            internal funcs
     *
     * In order to ensure that the functions will coincide in two neighbouring elements, they will be then sorted by
     * their sides' GLOBAL ids instead of their LOCAL ids
     ******************************************************************************************************************/

    
    const auto nFaces = TSHAPE::Dimension < 2 ? 0 : TSHAPE::NumSides(2);
    const auto nEdges = TSHAPE::NumSides(1);
    constexpr auto nNodes = TSHAPE::NCornerNodes;

    const auto nConnects = connectOrder.size();
    TPZManVector<int, TSHAPE::NSides - nNodes>
        transformationIds(TSHAPE::NSides - nNodes, -1);
    //computing transformation id for sides.
    for (auto iCon = 0; iCon < nConnects; iCon++) {
        transformationIds[iCon] = TSHAPE::GetTransformId(nNodes + iCon, nodeIds);
    }
    
    unsigned int shapeCount = 0;


    //calculates edge functions
    for (auto iCon = 0; iCon < nEdges; iCon++) {
        const auto pOrder = connectOrder[iCon];
        //there will be 2 + pOrder - 1 = pOrder + 1 functions for each edge

        for (auto iNode = 0; iNode < 2; iNode++) {
            auto whichNode = transformationIds[iCon] == 0 ? iNode : (iNode + 1) % 2;
            const int vecIndex = iCon * 2 + whichNode;
            const int64_t shapeIndex = TSHAPE::SideNodeLocId(iCon + nNodes, whichNode);
            indexVecShape[shapeCount] = std::make_pair(vecIndex, shapeIndex);
            shapeCount++;
            shapeCountVec[iCon]++;
        }//phi^ea funcs
        const int vecIndex = nEdges * 2 + iCon;
        for (int iEdgeInternal = 0; iEdgeInternal < pOrder - 1; iEdgeInternal++) {
            const int shapeIndex = firstH1ShapeFunc[iCon] + iEdgeInternal;
            indexVecShape[shapeCount] = std::make_pair(vecIndex, shapeIndex);
            shapeCount++;
            shapeCountVec[iCon]++;
        }//phi^et funcs
    }

    const int firstFaceShape = shapeCount;

#ifdef PZ_LOG2
    if (logger.isDebugEnabled()) {
        std::ostringstream sout;
        sout << __PRETTY_FUNCTION__ << '\n'
             << " n shape funcs (edge connects): "<<shapeCount<<'\n';
        //thats way too much info, uncomment if needed
        
        // sout << "vec shape index (edge connects):" << std::endl;
        // for (int iShape = 0; iShape < firstFaceShape; iShape++) {
        //     auto pair = indexVecShape[iShape];
        //     sout << "\tvec: " << pair.first << "\tshape: " << pair.second << std::endl;
        // }
        LOGPZ_DEBUG(logger, sout.str())
            }
#endif
    if(TSHAPE::Dimension < 2) return;
    /**
     * In order to ease the calculation of the indexes, these structures will store, respectively:
     * a) firstVfeVec the first Vfe vector for each face
     * b) faceEdges the edges contained in a certain face
     * c) firstVftVec the first Vft vector. Then, it is firstVftVec + 2*iFace + iVec
     * d) firstVfOrthVec the first VfOrthVec. Then, it is firstVfOrthVec + iFace
     */
    TPZManVector<int> firstVfeVec(nFaces,-1);
    TPZManVector<TPZStack<int>> faceEdges(nFaces,TPZStack<int>(0,0));
    {
        //we skip v^{e,a} and v^{e,T} vectors
        const int nEdgeVectors = nEdges * 3;
        firstVfeVec[0] = nEdgeVectors;
        for(auto iFace = 0; iFace < nFaces; iFace++){
            TSHAPE::LowerDimensionSides(iFace + nEdges + nNodes, faceEdges[iFace], 1);
            const int nFaceEdges = iFace == 0 ? 0 : faceEdges[iFace-1].size();
            firstVfeVec[iFace] = iFace == 0 ?
                firstVfeVec[iFace] : firstVfeVec[iFace - 1] + nFaceEdges;
        }
    }
    const int firstVftVec = firstVfeVec[nFaces-1] + faceEdges[nFaces-1].size();
    const int firstVfOrthVec = firstVftVec + 2 * nFaces;

    const int nH1Funcs = TSHAPE::NShapeF(sidesH1Ord);
    TPZGenMatrix<int> shapeorders(nH1Funcs,3);
    TSHAPE::ShapeOrder(nodeIds,sidesH1Ord, shapeorders);
    
    for(auto iCon = nEdges; iCon < nEdges + nFaces; iCon++){
        const auto iSide = iCon + nNodes;
        const auto iFace = iCon - nEdges;

        int h1FaceOrder = -1;
        TPZManVector<int,4> permutedSideSides(4,-1);
        
        switch(TSHAPE::Type(iSide)){
        case ETriangle://triangular face
            pztopology::GetPermutation<pztopology::TPZTriangle>(transformationIds[iCon],
                                                                permutedSideSides);
            h1FaceOrder = connectOrder[iCon];
            break;
        case EQuadrilateral://quadrilateral face
            pztopology::GetPermutation<pztopology::TPZQuadrilateral>(transformationIds[iCon],
                                                                     permutedSideSides);
            h1FaceOrder = connectOrder[iCon]+1;
            break;
        default:
            PZError<<__PRETTY_FUNCTION__<<" error."<<std::endl;
            DebugStop();
        }
#ifdef PZ_LOG2
        if (logger.isDebugEnabled()) {
            std::ostringstream sout;
            sout << "face :"<< iSide <<" permutation:"<< std::endl;
            for (auto i = 0; i < permutedSideSides.size(); i++) sout << permutedSideSides[i]<<"\t";
            sout<<std::endl;
            sout<<"transformation id:"<<transformationIds[iCon]<<std::endl;
            LOGPZ_DEBUG(logger, sout.str())
                }
#endif


        const int nFaceNodes = TSHAPE::NSideNodes(iSide);
        //this is not a mistake, since for faces nEdges = nNodes
        const int &nFaceEdges = nFaceNodes;

        //first the phi Fe functions
        for(auto iEdge = 0; iEdge < nFaceEdges; iEdge++ ){
            const auto currentLocalEdge = permutedSideSides[iEdge+nFaceNodes];
            const auto currentEdge = TSHAPE::ContainedSideLocId(iSide, currentLocalEdge);
            const auto vecIndex = firstVfeVec[iFace] + currentLocalEdge - nFaceNodes;
            
            for(auto iEdgeInternal = 0; iEdgeInternal < h1FaceOrder - 1; iEdgeInternal++){
                const int shapeIndex = firstH1ShapeFunc[currentEdge - nNodes] + iEdgeInternal;
                indexVecShape[shapeCount] = std::make_pair(vecIndex,shapeIndex);
                shapeCount++;
                shapeCountVec[iCon]++;
            }
        }

        const auto nVfeFuncs = shapeCountVec[iCon];
        
        /**now the phi Fi functions
           They are calculated differently for quad and triangular faces.
           For triangular faces, all the face functions of order k are taken,
           and each is multiplied by each of the tangent vectors associated with
           the face.
           For quadrilateral faces, the face functions of order k+1 are taken:
           since we are interested in the Q_{k,k+1}\times Q_{k+1,k} space,
           we check their orders.*/
        
        //number of h1 face funcs
        const auto nH1FaceFuncs =
            TSHAPE::NConnectShapeF(iSide,h1FaceOrder);
        
        const auto quadFace = TSHAPE::Type(iSide) == EQuadrilateral;
        
        if(quadFace){
            const auto transid = transformationIds[iCon];
            /*
              transformation id is 0 or 1 if starting at node 0
              transformation id is 2 or 3 if starting at node 1
              transformation id is 4 or 5 if starting at node 2
              transformation id is 6 or 7 if starting at node 3
              even numbers are counterclockwise dir,
              odd numbers are clockwise direction
              so ids 0, 3, 4, 7 have x as first dir
              and 1, 2, 5, 6 have y as first dir.

              we know that the vft vectors are created
              such that the first one is in x and the second one
              is in y (local face coordinates).
              therefore, we need the variables in the h1 functions
              to match.
              warning: sketchy integer arithmetic will follow:
             */
            const auto xdir = ((transid+1)/2)%2;//i told you so
            const auto ydir = 1-xdir;

            const auto hCurlFaceOrder = h1FaceOrder-1;
            const auto nfuncsk = 2 * (hCurlFaceOrder - 1) * (hCurlFaceOrder - 1);
            const auto nfuncsk1 = hCurlFaceOrder - 1;
            TPZVec<std::pair<int,int>> funcXY(nfuncsk);
            TPZVec<std::pair<int,int>> funcX(nfuncsk1);
            TPZVec<std::pair<int,int>> funcY(nfuncsk1);
            int countxy{0}, countx{0},county{0};
            /**now we assume that the first vft vec is in the x direction
               and that the next one is in the y direction.*/
            const int vecindex[] = {firstVftVec + 2*iFace,firstVftVec + 2*iFace+1};
            for(auto iFunc = 0; iFunc < nH1FaceFuncs; iFunc++ ){
                const auto shapeIndex = firstH1ShapeFunc[iCon] + iFunc;

                //functions of degree k
                if((shapeorders(shapeIndex,xdir) <= hCurlFaceOrder) &&
                   (shapeorders(shapeIndex,ydir) <= hCurlFaceOrder)){
                    funcXY[countxy++] = {vecindex[0],shapeIndex};
                    funcXY[countxy++] = {vecindex[1],shapeIndex};
                }else if(shapeorders(shapeIndex,xdir) <= hCurlFaceOrder){
                    funcX[countx++] = {vecindex[0],shapeIndex};
                }else if(shapeorders(shapeIndex,ydir) <= hCurlFaceOrder){
                    funcY[county++] = {vecindex[1],shapeIndex};
                }
            }

            auto AddFromVec = [&indexVecShape,&shapeCountVec, &shapeCount,iCon]
                (TPZVec<std::pair<int,int>> myvec){
                for(auto [vi,si] : myvec){
                    indexVecShape[shapeCount] = std::make_pair(vi,si);
                    shapeCount++;
                    shapeCountVec[iCon]++;
                }
            };
            AddFromVec(funcXY);
            AddFromVec(funcX);
            AddFromVec(funcY);
            
        }
        else{
            //ok that one is easy to guess
            const auto nFaceInternalFuncs =
                2 * nH1FaceFuncs;
            for(auto iFunc = 0; iFunc < nFaceInternalFuncs; iFunc++ ){
                //it should alternate between them
                const auto vecIndex = firstVftVec + 2*iFace + iFunc % 2;
                //they should repeat
                const auto shapeIndex = firstH1ShapeFunc[iCon] + iFunc / 2;
                indexVecShape[shapeCount] = std::make_pair(vecIndex,shapeIndex);
                shapeCount++;
                shapeCountVec[iCon]++;
            }
        }

        const auto nVfiFuncs = shapeCountVec[iCon] - nVfeFuncs;
#ifdef PZ_LOG2
        if (logger.isDebugEnabled()) {
            std::ostringstream sout;
            sout << "iFace: "<<iFace<<' '
                 << "nVfeFuncs: "<< nVfeFuncs <<' '
                 << "nVfiFuncs: "<< nVfiFuncs << '\n';
            LOGPZ_DEBUG(logger, sout.str())
                }
#endif
    }

#ifdef PZ_LOG2
    if (logger.isDebugEnabled()) {
        std::ostringstream sout;
        sout << "n shape funcs (face connects): "
             << firstInternalShape - firstFaceShape << '\n';
        //way too much info, uncomment if needed
        // sout << "vec shape index (face connects):" << std::endl;
        // for (int iShape = firstFaceShape; iShape < firstInternalShape; iShape++) {
        //     auto pair = indexVecShape[iShape];
        //     sout << "\tvec: " << pair.first << "\tshape: " << pair.second << std::endl;
        // }
        LOGPZ_DEBUG(logger, sout.str())
            }
#endif

    if(TSHAPE::Dimension < 3) return;

    const int firstInternalShape = shapeCount;
    
    const int iCon = nEdges + nFaces;
    //hcurl connect order
    const auto sideOrder = connectOrder[iCon];
    //first, the phi KF functions
    for(int iFace = 0; iFace < nFaces; iFace++){
        const auto faceSide = iFace + nEdges + nNodes;
        const auto faceType = TSHAPE::Type(faceSide);
        const auto faceDim = TSHAPE::SideDimension(faceSide);
        const auto faceOrderH1 =
            TSHAPE::Type() == EPrisma || TSHAPE::Type() == ECube ?
            sideOrder + 1 : sideOrder;
        const auto nH1FaceFuncs =
            TSHAPE::NConnectShapeF(faceSide,faceOrderH1);
        const auto vecIndex = firstVfOrthVec + iFace;

        for(auto iFunc = 0; iFunc < nH1FaceFuncs; iFunc++ ){
            const auto shapeIndex = firstH1ShapeFunc[nEdges + iFace] + iFunc;

            bool skip = false;
            if constexpr(TSHAPE::Type() == EPrisma){
                const int ordvec[] =
                    {shapeorders(shapeIndex,0),shapeorders(shapeIndex,1)};
                skip = true;
                if((TSHAPE::Type(faceSide) == EQuadrilateral) &&
                   (ordvec[0] <= sideOrder) &&
                   (ordvec[1] <= sideOrder+1)){
                    //for quad faces ordvec[0] = xord and ordvec[1] = zord
                    skip = false;
                    
                }
                else if(TSHAPE::Type(faceSide) == ETriangle){
                    skip = false;
                }
            }
            if(!skip){
                indexVecShape[shapeCount] = std::make_pair(vecIndex,shapeIndex);
                shapeCount++;
                shapeCountVec[iCon]++;
            }
        }   
    }

    const auto nKfFuncs = shapeCount - firstInternalShape;

    const auto h1InternalOrd = sidesH1Ord[nEdges+nFaces];
    //now the phi Ki funcs
    const int firstInternalVec = firstVfOrthVec + nFaces;
    //ALL H1 internal functions
    const auto nH1Internal =
        TSHAPE::NConnectShapeF(TSHAPE::NSides - 1, h1InternalOrd);

    const auto xVecIndex = firstInternalVec + 0;
    const auto yVecIndex = firstInternalVec + 1;
    const auto zVecIndex = firstInternalVec + 2;

    auto addFunc = [&indexVecShape,&shapeCount,&shapeCountVec,iCon](
      int vIndex, int sIndex){
        indexVecShape[shapeCount] = std::make_pair(vIndex, sIndex);
        shapeCount++;
        shapeCountVec[iCon]++;
    };
    /**in order to filter the gradients of hcurl functions,
       we need to sort the shape functions for the hexahedral el*/
    auto AddToVec = [](TPZVec<std::pair<int,int>> &v,std::pair<int,int> vs){
        const auto vi = v.size();
        v.Resize(vi+1);
        v[vi] = vs;
    };

    TPZVec<std::pair<int,int>> funcXYZ, funcX, funcY, funcZ;
    
    
    for(auto iFunc = 0; iFunc < nH1Internal; iFunc++ ){
        const auto shapeIndex = firstH1ShapeFunc[iCon] + iFunc;
        const int xord = shapeorders(shapeIndex,0);
        const int yord = shapeorders(shapeIndex,1);
        const int zord = shapeorders(shapeIndex,2);
        if constexpr(TSHAPE::Type() == ECube){
            if(xord <= sideOrder && yord <= sideOrder && zord <= sideOrder){
                AddToVec(funcXYZ, std::make_pair(xVecIndex,shapeIndex));
                AddToVec(funcXYZ, std::make_pair(yVecIndex,shapeIndex));
                AddToVec(funcXYZ, std::make_pair(zVecIndex,shapeIndex));
            }
            else{
                if(xord <= sideOrder){
                    AddToVec(funcX, std::make_pair(xVecIndex,shapeIndex));
                }
                if(yord <= sideOrder){
                    AddToVec(funcY, std::make_pair(yVecIndex,shapeIndex));
                }
                if(zord <= sideOrder){
                    AddToVec(funcZ, std::make_pair(zVecIndex,shapeIndex));
                }
            }
        }
        else if constexpr(TSHAPE::Type() == EPrisma){
            if((xord <= sideOrder) &&
               (yord <= sideOrder) &&
               (zord <= sideOrder+1)){
                addFunc(xVecIndex,shapeIndex);
                addFunc(yVecIndex,shapeIndex);
            }
            if((xord <= sideOrder+1) &&
               (yord <= sideOrder+1) &&
               (zord <= sideOrder)){
                addFunc(zVecIndex,shapeIndex);
            }
        }
        else{
            addFunc(xVecIndex,shapeIndex);
            addFunc(yVecIndex,shapeIndex);
            addFunc(zVecIndex,shapeIndex);
        }
    }
    //now we actually add the functions
    if constexpr(TSHAPE::Type() == ECube){
        for(auto [v,s] : funcXYZ){
            addFunc(v,s);
        }
        for(auto [v,s] : funcX){
            addFunc(v,s);
        }
        for(auto [v,s] : funcY){
            addFunc(v,s);
        }
        for(auto [v,s] : funcZ){
            addFunc(v,s);
        }
    }
    
    if(shapeCount != indexVecShape.size()){
        DebugStop();
    }
#ifdef PZ_LOG2
    if (logger.isDebugEnabled()) {
        const auto nInternalFuncs = shapeCount - firstInternalShape;
        const auto nKiFuncs = nInternalFuncs - nKfFuncs;
        std::ostringstream sout;
        sout << "n shape funcs (internal connect): "
             << shapeCount - firstInternalShape << '\n'
             << "\t n kf funcs : " << nKfFuncs
             << "\t n ki funcs : " << nKiFuncs << '\n';
        LOGPZ_DEBUG(logger, sout.str())
            }
#endif
}